

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImDrawList::~ImDrawList(ImDrawList *this)

{
  ImDrawList *this_local;
  
  ClearFreeMemory(this);
  ImDrawListSplitter::~ImDrawListSplitter(&this->_Splitter);
  ImVector<ImVec2>::~ImVector(&this->_Path);
  ImVector<void_*>::~ImVector(&this->_TextureIdStack);
  ImVector<ImVec4>::~ImVector(&this->_ClipRectStack);
  ImVector<ImDrawVert>::~ImVector(&this->VtxBuffer);
  ImVector<unsigned_short>::~ImVector(&this->IdxBuffer);
  ImVector<ImDrawCmd>::~ImVector(&this->CmdBuffer);
  return;
}

Assistant:

~ImDrawList() { ClearFreeMemory(); }